

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalValueDatabase.cpp
# Opt level: O2

void __thiscall OptimalValueDatabase::Save(OptimalValueDatabase *this)

{
  ostream *poVar1;
  E *this_00;
  string local_3c0;
  stringstream ss;
  ostream local_390 [376];
  ofstream fp;
  undefined8 auStack_210 [3];
  byte abStack_1f8 [480];
  
  std::ofstream::ofstream(&fp,(this->_filename)._M_dataplus._M_p,_S_out);
  if ((abStack_1f8[*(long *)(_fp + -0x18)] & 5) == 0) {
    *(undefined8 *)((long)auStack_210 + *(long *)(_fp + -0x18)) = 0x10;
    poVar1 = std::operator<<((ostream *)&fp,"problem discount horizon value");
    std::endl<char,std::char_traits<char>>(poVar1);
    SoftPrint_abi_cxx11_((string *)&ss,this);
    std::operator<<((ostream *)&fp,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    std::ofstream::~ofstream(&fp);
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_390,"OptimalValueDatabase::Save() failed to open file ");
  poVar1 = std::operator<<(poVar1,(string *)&this->_filename);
  std::endl<char,std::char_traits<char>>(poVar1);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this_00,&local_3c0);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void OptimalValueDatabase::Save() const
{
    ofstream fp(_filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "OptimalValueDatabase::Save() failed to open file "
           << _filename << endl;
        throw E(ss.str());
    }

    fp.precision(16);
    
    fp << "problem discount horizon value" << endl;
    fp << SoftPrint();
}